

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::SideShape
               (int side,TPZVec<double> *point,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  
  if (0xf < (uint)side) {
    std::operator<<((ostream *)&std::cerr,"TPZCompElT3d::SideShapeFunction. Bad paramenter side.\n")
    ;
    return;
  }
  if (side == 0xe) {
    Shape(point,id,order,phi,dphi);
    return;
  }
  if ((uint)side < 4) {
    pdVar1 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar1 = 1.0;
    return;
  }
  if ((uint)side < 10) {
    TPZShapeLinear::Shape(point,id,order,phi,dphi);
    return;
  }
  if ((uint)side < 0xe) {
    TPZShapeTriang::Shape(point,id,order,phi,dphi);
    return;
  }
  return;
}

Assistant:

void TPZShapeTetra::SideShape(int side, TPZVec<REAL> &point, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		if(side<0 || side>15) PZError << "TPZCompElT3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==14) Shape(point,id,order,phi,dphi);
		else if(side<4) phi(0,0)=1.;
		else if(side<10) {//4 a 9
			TPZShapeLinear::Shape(point,id,order,phi,dphi);
		}
		else if(side<14) {//faces 10,11,12,13
			TPZShapeTriang::Shape(point,id,order,phi,dphi);
		}
		
	}